

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckFuncTypeIndex(SharedValidator *this,Var *sig_var,FuncType *out)

{
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  int __c;
  int __c_00;
  Var *var;
  _Self *__y;
  _Self local_c8;
  key_type local_bc;
  _Self local_b8;
  iterator iter;
  Var local_78;
  Result local_2c;
  FuncType *pFStack_28;
  Result result;
  FuncType *out_local;
  Var *sig_var_local;
  SharedValidator *this_local;
  
  pFStack_28 = out;
  Var::Var(&local_78,sig_var);
  var = &local_78;
  local_2c = CheckIndex(this,var,this->num_types_,"function type");
  Var::~Var(&local_78);
  bVar1 = Failed(local_2c);
  if (bVar1) {
    memset(&iter,0,0x30);
    FuncType::FuncType((FuncType *)&iter);
    FuncType::operator=(pFStack_28,(FuncType *)&iter);
    FuncType::~FuncType((FuncType *)&iter);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pcVar2 = Var::index(sig_var,(char *)var,__c);
    local_bc = (key_type)pcVar2;
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_wabt::SharedValidator::FuncType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>_>
         ::find(&this->func_types_,&local_bc);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_wabt::SharedValidator::FuncType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>_>
         ::end(&this->func_types_);
    __y = &local_c8;
    bVar1 = std::operator==(&local_b8,__y);
    if (bVar1) {
      pcVar2 = Var::index(sig_var,(char *)__y,__c_00);
      this_local._4_4_ =
           PrintError(this,&sig_var->loc,"type %d is not a function",(ulong)pcVar2 & 0xffffffff);
    }
    else {
      if (pFStack_28 != (FuncType *)0x0) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>
                 ::operator->(&local_b8);
        FuncType::operator=(pFStack_28,&ppVar3->second);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckFuncTypeIndex(Var sig_var, FuncType* out) {
  Result result = CheckIndex(sig_var, num_types_, "function type");
  if (Failed(result)) {
    *out = FuncType{};
    return Result::Error;
  }

  auto iter = func_types_.find(sig_var.index());
  if (iter == func_types_.end()) {
    return PrintError(sig_var.loc, "type %d is not a function",
                      sig_var.index());
  }

  if (out) {
    *out = iter->second;
  }
  return Result::Ok;
}